

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void setup_used_hard_regs(gen_ctx_t gen_ctx,MIR_type_t type,MIR_reg_t hard_reg)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  long *plVar3;
  bitmap_el_t bVar4;
  MIR_reg_t *pMVar5;
  ulong *puVar6;
  void *pvVar7;
  VARR_MIR_reg_t *pVVar8;
  VARR_spill_cache_el_t *pVVar9;
  spill_cache_el_t *psVar10;
  bitmap_t *ppVVar11;
  VARR_live_range_t *pVVar12;
  undefined8 uVar13;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar14 [32];
  anon_union_32_12_57d33f68_for_u aVar15;
  anon_union_32_12_57d33f68_for_u aVar16;
  undefined1 auVar17 [32];
  anon_union_32_12_57d33f68_for_u aVar18;
  MIR_op_mode_t MVar19;
  MIR_type_t MVar20;
  MIR_reg_t MVar21;
  int iVar22;
  gen_ctx_t pgVar23;
  gen_ctx *extraout_RAX;
  bitmap_el_t *pbVar24;
  ra_ctx *prVar25;
  ulong uVar26;
  MIR_insn_t_conflict pMVar27;
  int64_t iVar28;
  MIR_insn_t_conflict insn;
  gen_ctx *pgVar29;
  undefined1 (*pauVar30) [32];
  live_range_t_conflict plVar31;
  char cVar32;
  int iVar33;
  int iVar34;
  long *in_RCX;
  bitmap_el_t *pbVar35;
  ulong uVar36;
  MIR_insn_t pMVar37;
  long lVar38;
  MIR_disp_t MVar39;
  int extraout_EDX;
  MIR_reg_t base_reg;
  MIR_reg_t base_reg_00;
  int extraout_EDX_00;
  long extraout_RDX;
  undefined8 *puVar40;
  MIR_insn_t extraout_RDX_00;
  anon_union_32_12_57d33f68_for_u *paVar41;
  char *pcVar42;
  MIR_context_t bm;
  uint uVar43;
  gen_ctx *pgVar44;
  gen_ctx_t pgVar46;
  FILE *pFVar47;
  bool bVar48;
  uint uVar49;
  undefined8 unaff_RBP;
  ulong uVar50;
  uint uVar51;
  bitmap_t pVVar52;
  gen_ctx *pgVar53;
  ulong uVar54;
  VARR_bitmap_t *pVVar55;
  bitmap_t pVVar56;
  gen_ctx_t pgVar57;
  gen_ctx_t pgVar58;
  gen_ctx_t pgVar59;
  ulong uVar60;
  MIR_context_t pMVar61;
  uint *in_R8;
  gen_ctx_t res;
  long lVar62;
  int iVar63;
  size_t sVar64;
  undefined8 *puVar65;
  uint uVar66;
  long lVar67;
  gen_ctx_t pgVar68;
  uint *puVar69;
  MIR_op_t *pMVar70;
  byte bVar71;
  undefined8 unaff_R13;
  MIR_context_t pMVar72;
  uint *puVar73;
  uint *puVar74;
  gen_ctx_t pgVar75;
  lr_gap_t el;
  MIR_reg_t MStack_4b0;
  MIR_op_t MStack_468;
  ulong *puStack_430;
  ulong uStack_428;
  bitmap_el_t *pbStack_420;
  ulong uStack_418;
  gen_ctx_t pgStack_410;
  code *pcStack_408;
  uint uStack_344;
  uint uStack_340;
  int iStack_33c;
  anon_union_32_12_57d33f68_for_u *paStack_338;
  MIR_op_t *pMStack_330;
  MIR_insn_t_conflict pMStack_328;
  size_t sStack_320;
  MIR_insn_t pMStack_318;
  MIR_op_t MStack_310;
  MIR_op_t MStack_2e0;
  MIR_op_t MStack_2b0;
  void *apvStack_280 [2];
  int64_t iStack_270;
  char *pcStack_268;
  undefined8 uStack_260;
  MIR_disp_t MStack_258;
  bitmap_t pVStack_250;
  bitmap_t pVStack_248;
  bitmap_t pVStack_240;
  bitmap_t pVStack_238;
  bitmap_t pVStack_230;
  bitmap_t pVStack_228;
  int aiStack_220 [12];
  undefined1 auStack_1f0 [16];
  undefined1 auStack_1e0 [16];
  undefined1 auStack_1d0 [16];
  gen_ctx_t pgStack_188;
  gen_ctx_t pgStack_180;
  MIR_context_t pMStack_178;
  bitmap_t pVStack_170;
  gen_ctx_t pgStack_168;
  code *pcStack_160;
  gen_ctx_t pgStack_150;
  gen_ctx *pgStack_148;
  gen_ctx *pgStack_140;
  MIR_insn_t pMStack_138;
  MIR_context_t pMStack_130;
  uint uStack_124;
  gen_ctx_t pgStack_120;
  gen_ctx_t pgStack_118;
  ulong uStack_110;
  bitmap_el_t *pbStack_108;
  gen_ctx_t pgStack_100;
  gen_ctx_t pgStack_f8;
  MIR_context_t pMStack_f0;
  ulong uStack_e8;
  gen_ctx_t pgStack_e0;
  code *pcStack_d8;
  gen_ctx *pgStack_d0;
  gen_ctx_t pgStack_c8;
  gen_ctx_t pgStack_c0;
  MIR_context_t pMStack_b8;
  ulong uStack_b0;
  gen_ctx_t pgStack_a8;
  code *pcStack_a0;
  gen_ctx *pgStack_98;
  gen_ctx_t pgStack_90;
  gen_ctx_t pgStack_88;
  gen_ctx_t pgStack_80;
  code *pcStack_78;
  ulong uStack_68;
  gen_ctx_t pgStack_60;
  MIR_context_t pMStack_58;
  gen_ctx_t pgStack_50;
  bitmap_t pVStack_48;
  code *pcStack_40;
  gen_ctx_t pgVar45;
  
  pMVar72 = (MIR_context_t)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  bVar48 = type == MIR_T_LD && 0x21 < hard_reg;
  uVar50 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar48);
  iVar33 = 0;
  do {
    if (iVar33 + hard_reg < 0x22) {
      pVVar52 = gen_ctx->func_used_hard_regs;
      pgVar68 = (gen_ctx_t)(ulong)(iVar33 + hard_reg);
      pgVar53 = (gen_ctx *)((long)&pgVar68->ctx + 1);
      pcStack_40 = (code *)0x16de3d;
      pVVar56 = pVVar52;
      bitmap_expand(pVVar52,(size_t)pgVar53);
      if (pVVar52 == (bitmap_t)0x0) {
        pcStack_40 = get_stack_loc;
        setup_used_hard_regs_cold_1();
        sVar64 = pVVar56[0x13].size;
        pgVar29 = (gen_ctx *)(sVar64 + 0x21);
        if (pgVar29 < (gen_ctx *)((ulong)pgVar53 & 0xffffffff)) goto LAB_0016df1c;
        uVar43 = 0xffffffff;
        pgVar59 = (gen_ctx_t)0x0;
        uVar26 = uVar50;
        pgVar58 = pgVar68;
        pMVar61 = pMVar72;
        pgVar46 = gen_ctx;
        goto LAB_0016de9d;
      }
      in_RCX = (long *)(1L << ((ulong)pgVar68 & 0x3f));
      *pVVar52->varr = *pVVar52->varr | (ulong)in_RCX;
    }
    iVar33 = 1;
    bVar71 = (byte)pMVar72;
    pMVar72 = (MIR_context_t)0x0;
    if ((bVar48 & bVar71) == 0) {
      return;
    }
  } while( true );
LAB_00170360:
  if ((iVar63 != -1) && (*(int *)((long)pvVar7 + lVar67 + lVar38 + 4) == iVar63)) {
    return;
  }
  iVar22 = *(int *)((long)pvVar7 + lVar67 + lVar38 + 8);
  if (uVar43 == 0) {
    iVar34 = 10;
    if (uVar49 < 3) {
      iVar34 = *(int *)(&DAT_001b1a90 + (ulong)uVar49 * 4);
    }
    uVar51 = 1;
    if (iVar22 != iVar34) goto LAB_00170398;
  }
  else {
LAB_00170398:
    iVar34 = 0xb;
    if (uVar49 < 3) {
      iVar34 = *(int *)(&DAT_001b1a9c + (ulong)uVar49 * 4);
    }
    uVar51 = uVar43;
    if (iVar22 == iVar34) {
      uVar51 = 2;
    }
  }
  uVar43 = uVar51;
  lVar67 = lVar67 + 0xc;
  if (lVar62 * 0xc == lVar67) {
    if (1 < uVar43) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
LAB_001703e4:
    if (extraout_EDX_00 == 10) {
      iVar22 = -1;
    }
    else {
      if ((extraout_EDX_00 == 9) || (extraout_EDX_00 == 8)) {
        iVar22 = 0x19;
      }
      else {
        iVar22 = 0xb;
      }
      iVar22 = iVar22 - (uint)(uVar43 == 0);
    }
    *(int *)((long)pvVar7 + uVar50 * 4 + 0x180) = iVar33 + 1;
    if (7 < iVar33) {
      __assert_fail("rld_num < (2 * 4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
    *(int *)((long)pvVar7 + lVar62 * 0xc + lVar38 + 4) = iVar63;
    *(int *)((long)pvVar7 + lVar62 * 0xc + lVar38) = extraout_EDX_00;
    *(int *)((long)pvVar7 + lVar62 * 0xc + lVar38 + 8) = iVar22;
    return;
  }
  goto LAB_00170360;
LAB_0017022a:
  spill_restore_reg_cold_7();
LAB_0017022f:
  __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
LAB_0016de9d:
  do {
    uVar51 = (uint)pgVar53;
    bVar48 = 0x21 < uVar51 && extraout_EDX == 10;
    uVar49 = (uint)bVar48;
    uVar66 = uVar49 + 1;
    pgVar44 = (gen_ctx *)(ulong)(uVar51 + bVar48);
    if (pgVar29 < pgVar44) break;
    if (in_RCX == (long *)0x0) {
      pcStack_78 = available_hreg_p;
      uStack_68 = (ulong)hard_reg;
      pgStack_60 = pgVar68;
      pMStack_58 = pMVar72;
      pgStack_50 = gen_ctx;
      pVStack_48 = pVVar52;
      pcStack_40 = (code *)uVar50;
      get_stack_loc_cold_1();
      iVar33 = (int)in_RCX[1];
      iVar63 = *(int *)((long)in_RCX + 0xc);
      pbVar35 = (bitmap_el_t *)(long)iVar63;
      if (iVar63 < iVar33) {
        return;
      }
      pgVar23 = (gen_ctx_t)(long)(int)pVVar56;
      uVar50 = 0;
      uVar49 = (int)pVVar56 + 1;
      puVar65 = (undefined8 *)(1L << ((ulong)pgVar23 & 0x3f));
      pgVar57 = (gen_ctx_t)((ulong)pgVar23 >> 6);
      uVar43 = (iVar63 - iVar33) + 1;
      res = (gen_ctx_t)(long)iVar33;
      pgVar68 = pgVar58;
      pgVar75 = pgVar59;
      while( true ) {
        pgVar45 = (gen_ctx_t)(ulong)uVar43;
        plVar3 = *(long **)(extraout_RDX + (long)res * 8);
        if (plVar3 == (long *)0x0) break;
        pgVar75 = (gen_ctx_t)(*plVar3 << 6);
        if ((pgVar23 < pgVar75) &&
           (pgVar68 = (gen_ctx_t)plVar3[2],
           ((ulong)pgVar68->call_used_hard_regs[(long)((long)&pgVar57[-1].spot2attr + 3)] &
           (ulong)puVar65) != 0)) {
          return;
        }
        if (1 < (int)pgVar53) {
          if (0x21 < uVar49) {
            return;
          }
          if (((gen_ctx_t)(ulong)uVar49 < pgVar75) &&
             ((*(ulong *)plVar3[2] & 1L << ((ulong)uVar49 & 0x3f)) != 0)) {
            return;
          }
        }
        uVar50 = (ulong)((long)pbVar35 <= (long)res);
        uVar43 = uVar43 - 1;
        res = (gen_ctx_t)((long)&res->ctx + 1);
        if (uVar43 == 0) {
          return;
        }
      }
      pcStack_a0 = gap_lr_spill_cost;
      pgStack_98 = pgVar44;
      pgStack_90 = pgVar58;
      pgStack_88 = pgVar46;
      pgStack_80 = pgVar59;
      pcStack_78 = (code *)uVar26;
      available_hreg_p_cold_1();
      pVVar52 = pgVar57->temp_bitmap;
      uStack_b0 = 0;
      pgVar58 = pgVar57;
      uVar26 = uStack_b0;
      pgStack_d0 = extraout_RAX;
      pgStack_c8 = pgVar45;
      pgStack_c0 = pgVar68;
      pMStack_b8 = pMVar61;
      pgStack_a8 = pgVar75;
      pcStack_a0 = (code *)uVar50;
      if ((pVVar52 != (bitmap_t)0x0) && (pVVar52->varr != (bitmap_el_t *)0x0)) {
        pVVar52->els_num = 0;
        uVar26 = 0;
        pMVar61 = pgVar53->ctx;
        if (pMVar61 == (MIR_context_t)0x0) {
          return;
        }
        uVar50 = 1;
        pgStack_d0 = pgVar53;
        while( true ) {
          pgVar68 = (gen_ctx_t)pgVar57->temp_bitmap;
          pgVar75 = (gen_ctx_t)pMVar61->gen_ctx->ctx;
          pgVar53 = (gen_ctx *)((long)&pgVar75->ctx + 1);
          pcStack_d8 = (code *)0x16e073;
          pgVar58 = pgVar68;
          bitmap_expand((bitmap_t)pgVar68,(size_t)pgVar53);
          if (pgVar68 == (gen_ctx_t)0x0) break;
          pbVar35 = (bitmap_el_t *)((ulong)pgVar75 >> 6);
          puVar6 = (ulong *)((long)((MIR_insn_t)pgVar68->curr_func_item)->ops +
                            (long)pbVar35 * 8 + -0x20);
          *puVar6 = *puVar6 | 1L << ((ulong)pgVar75 & 0x3f);
          pMVar61 = (MIR_context_t)pMVar61->c2mir_ctx;
          if (pMVar61 == (MIR_context_t)0x0) {
            pMVar72 = pgStack_d0->ctx;
            if (pMVar72 == (MIR_context_t)0x0) {
              return;
            }
            uVar26 = 0;
            do {
              pgVar29 = pMVar72->gen_ctx;
              pVVar52 = pgVar29->call_used_hard_regs[6];
              iVar33 = -2;
              do {
                iVar63 = iVar33;
                pVVar52 = (bitmap_t)pVVar52[1].els_num;
                iVar33 = iVar63 + 1;
              } while (pVVar52 != (bitmap_t)0x0);
              if (iVar33 < 0) {
LAB_0016e1f7:
                pcStack_d8 = (code *)0x16e216;
                __assert_fail("level >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1748,"int bb_loop_level(bb_t)");
              }
              pgVar53 = (gen_ctx *)pgVar29->addr_regs;
              uVar43 = iVar63 + 2;
              pbVar35 = (bitmap_el_t *)(ulong)uVar43;
              if (pgVar53 != (gen_ctx *)0x0) {
                res = (gen_ctx_t)pgVar57->temp_bitmap;
                if (res == (gen_ctx_t)0x0) goto LAB_0016e21b;
                pgVar58 = (gen_ctx_t)0xffffffff;
                puVar65 = (undefined8 *)((long)res->ctx << 6);
                do {
                  pMVar37 = ((DLIST_LINK_MIR_insn_t *)&pgVar53->optimize_level)->prev;
                  puVar40 = (undefined8 *)pMVar37->data;
                  if (puVar40 < puVar65) {
                    pgVar68 = (gen_ctx_t)((ulong)puVar40 >> 6);
                    pgVar75 = *(gen_ctx_t *)
                               ((long)((MIR_insn_t)res->curr_func_item)->ops +
                               (long)pgVar68 * 8 + -0x20);
                    if (((ulong)pgVar75 >> ((ulong)puVar40 & 0x3f) & 1) == 0) goto LAB_0016e114;
                  }
                  else {
LAB_0016e114:
                    MVar39 = pMVar37[1].ops[0].u.mem.disp;
                    iVar33 = -2;
                    do {
                      iVar63 = iVar33;
                      MVar39 = *(long *)(MVar39 + 0x18);
                      iVar33 = iVar63 + 1;
                    } while (MVar39 != 0);
                    if (iVar33 < 0) goto LAB_0016e1f7;
                    if ((int)pgVar58 <= iVar33) {
                      pgVar58 = (gen_ctx_t)(ulong)(iVar63 + 2);
                    }
                  }
                  pgVar53 = (gen_ctx *)pgVar53->to_free;
                } while (pgVar53 != (gen_ctx *)0x0);
                if (-1 < (int)pgVar58) {
                  if ((int)uVar43 <= (int)pgVar58) {
                    pgVar58 = (gen_ctx_t)(ulong)uVar43;
                  }
                  uVar26 = (ulong)(uint)((int)uVar26 + (int)pgVar58 * 2);
                }
              }
              puVar40 = *(undefined8 **)&pgVar29->addr_insn_p;
              if (puVar40 != (undefined8 *)0x0) {
                pgVar53 = (gen_ctx *)pgVar57->temp_bitmap;
                if (pgVar53 == (gen_ctx *)0x0) goto LAB_0016e220;
                pgVar58 = (gen_ctx_t)0xffffffff;
                res = (gen_ctx_t)((long)pgVar53->ctx << 6);
                do {
                  puVar65 = (undefined8 *)*puVar40;
                  pgVar59 = (gen_ctx_t)*puVar65;
                  if ((res <= pgVar59) ||
                     (pgVar75 = (gen_ctx_t)((ulong)pgVar59 >> 6),
                     (*(ulong *)((long)((MIR_insn_t)pgVar53->curr_func_item)->ops +
                                (long)pgVar75 * 8 + -0x20) >> ((ulong)pgVar59 & 0x3f) & 1) == 0)) {
                    lVar38 = puVar65[0x13];
                    puVar65 = (undefined8 *)0xfffffffe;
                    do {
                      lVar38 = *(long *)(lVar38 + 0x18);
                      iVar33 = (int)puVar65;
                      uVar49 = iVar33 + 1;
                      puVar65 = (undefined8 *)(ulong)uVar49;
                    } while (lVar38 != 0);
                    if ((int)uVar49 < 0) goto LAB_0016e1f7;
                    if ((int)pgVar58 <= (int)uVar49) {
                      pgVar58 = (gen_ctx_t)(ulong)(iVar33 + 2);
                    }
                  }
                  puVar40 = (undefined8 *)puVar40[3];
                } while (puVar40 != (undefined8 *)0x0);
                uVar49 = (uint)pgVar58;
                if (-1 < (int)uVar49) {
                  if ((int)uVar49 < (int)uVar43) {
                    uVar43 = uVar49;
                  }
                  uVar26 = (ulong)((int)uVar26 + uVar43 * 2);
                }
              }
              pMVar72 = (MIR_context_t)pMVar72->c2mir_ctx;
              if (pMVar72 == (MIR_context_t)0x0) {
                return;
              }
            } while( true );
          }
        }
        pcStack_d8 = (code *)0x16e21b;
        gap_lr_spill_cost_cold_3();
LAB_0016e21b:
        pcStack_d8 = (code *)0x16e220;
        gap_lr_spill_cost_cold_1();
LAB_0016e220:
        pcStack_d8 = (code *)0x16e225;
        gap_lr_spill_cost_cold_2();
        pgVar45 = pgVar57;
      }
      pcStack_d8 = HTAB_lr_gap_t_do;
      gap_lr_spill_cost_cold_4();
      pVVar52 = pgVar58->tied_regs;
      pgStack_140 = pgVar53;
      pgStack_100 = pgVar45;
      pgStack_f8 = pgVar68;
      pMStack_f0 = pMVar61;
      uStack_e8 = uVar26;
      pgStack_e0 = pgVar75;
      pcStack_d8 = (code *)uVar50;
      if (pVVar52 == (bitmap_t)0x0) {
        pcStack_160 = (code *)0x16e5b0;
        HTAB_lr_gap_t_do_cold_8();
        pgVar59 = pgVar58;
        pgVar58 = res;
        res = pgVar75;
LAB_0016e5b0:
        pcStack_160 = (code *)0x16e5b5;
        HTAB_lr_gap_t_do_cold_7();
LAB_0016e5b5:
        pcStack_160 = (code *)0x16e5ba;
        HTAB_lr_gap_t_do_cold_4();
        pVVar56 = pVVar52;
LAB_0016e5ba:
        pcStack_160 = (code *)0x16e5bf;
        HTAB_lr_gap_t_do_cold_3();
        pgVar46 = pgVar45;
LAB_0016e5bf:
        pcStack_160 = (code *)0x16e5c4;
        HTAB_lr_gap_t_do_cold_5();
LAB_0016e5c4:
        pcStack_160 = (code *)0x16e5c9;
        HTAB_lr_gap_t_do_cold_6();
        pVVar52 = pVVar56;
LAB_0016e5c9:
        pcStack_160 = (code *)0x16e5ce;
        HTAB_lr_gap_t_do_cold_1();
      }
      else {
        puVar40 = (undefined8 *)
                  (((anon_union_32_12_57d33f68_for_u *)&pgVar58->addr_insn_p)->str).len;
        pgVar59 = pgVar58;
        if (puVar40 == (undefined8 *)0x0) goto LAB_0016e5b0;
        pgStack_148 = (gen_ctx *)pgVar58->curr_func_item;
        pgVar45 = (gen_ctx_t)pVVar52->els_num;
        pgVar68 = (gen_ctx_t)((ulong)pbVar35 & 0xffffffff);
        uVar43 = (int)pbVar35 - 1;
        uVar50 = (ulong)uVar43;
        pgStack_150 = pgVar58;
        pMStack_138 = extraout_RDX_00;
        if (1 < uVar43) {
LAB_0016e3d9:
          pcStack_160 = (code *)0x16e3f0;
          pgVar59 = pgStack_140;
          iVar33 = (*(code *)pgStack_150->debug_file)(pgStack_140,pMStack_138,pgStack_148);
          uVar49 = iVar33 + (uint)(iVar33 == 0);
          pgVar53 = (gen_ctx *)(ulong)uVar49;
          pgVar58 = pgStack_150;
          if (pgStack_150->tied_regs == (bitmap_t)0x0) goto LAB_0016e5b5;
          pbVar35 = (bitmap_el_t *)
                    (((anon_union_32_12_57d33f68_for_u *)&pgStack_150->addr_insn_p)->str).len;
          pVVar56 = pVVar52;
          uStack_124 = uVar43;
          pgStack_120 = res;
          pgStack_118 = pgVar68;
          if (pbVar35 != (bitmap_el_t *)0x0) {
            pbVar24 = pgStack_150->tied_regs->varr;
            bVar4 = pbVar35[2];
            uVar50 = (ulong)((int)pgVar45 - 1);
            pMStack_130 = (MIR_context_t)CONCAT44(pMStack_130._4_4_,uVar49);
            pgVar29 = pgVar53;
            pgVar68 = pgStack_150;
            puVar73 = (uint *)0x0;
            uStack_110 = uVar50;
            pbStack_108 = pbVar24;
            do {
              uVar49 = uVar49 & (uint)uVar50;
              puVar69 = (uint *)((long)pbVar24 + (ulong)uVar49 * 4);
              uVar26 = (ulong)*puVar69;
              puVar74 = puVar69;
              if (uVar26 != 0xfffffffe) {
                if (*puVar69 == 0xffffffff) {
                  if (uStack_124 < 2) {
                    *(int *)&pgVar68->ctx = *(int *)&pgVar68->ctx + 1;
                    uVar50 = (ulong)*(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar68->optimize_level)->
                                              prev;
                    if (puVar73 != (uint *)0x0) {
                      puVar69 = puVar73;
                    }
                    *(int *)(bVar4 + uVar50 * 0x18) = (int)pgVar29;
                    *(gen_ctx **)(bVar4 + 8 + uVar50 * 0x18) = pgStack_140;
                    *(MIR_insn_t *)(bVar4 + 0x10 + uVar50 * 0x18) = pMStack_138;
                    uVar43 = *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar68->optimize_level)->prev;
                    *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgVar68->optimize_level)->prev = uVar43 + 1
                    ;
                    *puVar69 = uVar43;
                    pgStack_120->ctx = (MIR_context_t)pgStack_140;
                    ((DLIST_LINK_MIR_insn_t *)&pgStack_120->optimize_level)->prev = pMStack_138;
                    return;
                  }
                  return;
                }
                puVar74 = puVar73;
                if (*(int *)(bVar4 + uVar26 * 0x18) == (int)pgVar29) {
                  puVar1 = (undefined4 *)(bVar4 + uVar26 * 0x18);
                  pcStack_160 = (code *)0x16e48e;
                  iVar33 = (*(code *)((MIR_op_t *)&pgStack_150->debug_level)->data)
                                     (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),
                                      pgStack_140,pMStack_138,pgStack_148);
                  pgVar58 = pgStack_120;
                  pgVar29 = (gen_ctx *)((ulong)pMStack_130 & 0xffffffff);
                  uVar50 = uStack_110;
                  pbVar24 = pbStack_108;
                  pgVar68 = pgStack_150;
                  if (iVar33 != 0) {
                    if ((int)pgStack_118 == 3) {
                      *(int *)&pgStack_150->ctx = *(int *)&pgStack_150->ctx + -1;
                      *puVar69 = 0xfffffffe;
                      if (pgStack_150->to_free != (VARR_void_ptr_t *)0x0) {
                        pcStack_160 = (code *)0x16e590;
                        (*(code *)pgStack_150->to_free)
                                  (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),
                                   pgStack_148);
                      }
                      *puVar1 = 0;
                    }
                    else {
                      if ((int)pgStack_118 == 2) {
                        if (pgStack_150->to_free != (VARR_void_ptr_t *)0x0) {
                          pcStack_160 = (code *)0x16e54b;
                          (*(code *)pgStack_150->to_free)
                                    (*(undefined8 *)(puVar1 + 2),*(undefined8 *)(puVar1 + 4),
                                     pgStack_148);
                        }
                        *(gen_ctx **)(puVar1 + 2) = pgStack_140;
                        *(MIR_insn_t *)(puVar1 + 4) = pMStack_138;
                      }
                      pMVar37 = *(MIR_insn_t *)(puVar1 + 4);
                      pgVar58->ctx = *(MIR_context_t *)(puVar1 + 2);
                      ((DLIST_LINK_MIR_insn_t *)&pgVar58->optimize_level)->prev = pMVar37;
                    }
                    return;
                  }
                }
              }
              *(int *)&pgVar68->field_0xc = *(int *)&pgVar68->field_0xc + 1;
              pgVar53 = (gen_ctx *)((ulong)pgVar53 >> 0xb);
              uVar49 = (int)pgVar53 + 1 + uVar49 * 5;
              puVar73 = puVar74;
            } while( true );
          }
          goto LAB_0016e5ba;
        }
        pgVar46 = (gen_ctx_t)*puVar40;
        if (*(int *)&((DLIST_LINK_MIR_insn_t *)&pgVar58->optimize_level)->prev != (int)pgVar46)
        goto LAB_0016e3d9;
        pgVar59 = (gen_ctx_t)pVVar52->varr;
        pgVar53 = pgStack_148;
        pVVar56 = pVVar52;
        if (pgVar59 == (gen_ctx_t)0x0) goto LAB_0016e5c4;
        pMVar61 = (MIR_context_t)(ulong)((uint)pgVar45 * 2);
        if ((MIR_context_t)pVVar52->size != pMVar61) {
          pgVar53 = (gen_ctx *)((long)pMVar61 * 4);
          pcStack_160 = (code *)0x16e2c2;
          pMStack_130 = pMVar61;
          pbVar24 = (bitmap_el_t *)realloc(pgVar59,(size_t)pgVar53);
          pVVar52->varr = pbVar24;
          pVVar56 = pgStack_150->tied_regs;
          pVVar52->size = (size_t)pMStack_130;
          pVVar52->els_num = (size_t)pMStack_130;
          pgVar58 = pgStack_150;
          pMVar61 = pMStack_130;
          pVVar52 = pVVar56;
          if (pVVar56 != (bitmap_t)0x0) goto LAB_0016e2ea;
          goto LAB_0016e5c9;
        }
        pVVar52->els_num = (size_t)pMVar61;
LAB_0016e2ea:
        if ((int)pMVar61 != 0) {
          pgVar59 = (gen_ctx_t)pVVar56->varr;
          pgVar53 = (gen_ctx *)0xff;
          pcStack_160 = (code *)0x16e307;
          memset(pgVar59,0xff,(ulong)((uint)pgVar45 & 0x7fffffff) << 3);
        }
        pVVar56 = (bitmap_t)
                  (((anon_union_32_12_57d33f68_for_u *)&pgStack_150->addr_insn_p)->str).len;
        pgVar58 = pgStack_150;
        if ((pVVar56 == (bitmap_t)0x0) ||
           (pgVar59 = (gen_ctx_t)pVVar56->varr, pgVar59 == (gen_ctx_t)0x0)) goto LAB_0016e5bf;
        pgVar46 = (gen_ctx_t)(ulong)(uint)((int)pgVar46 * 2);
        if ((gen_ctx_t)pVVar56->size == pgVar46) {
          pVVar56->els_num = (size_t)pgVar46;
          pVVar52 = pVVar56;
LAB_0016e368:
          pbVar35 = pVVar52->varr;
          uVar49 = *(uint *)((long)&pgStack_150->ctx + 4);
          uVar51 = *(uint *)&((DLIST_LINK_MIR_insn_t *)&pgStack_150->optimize_level)->prev;
          *(undefined4 *)&pgStack_150->ctx = 0;
          *(undefined4 *)&((DLIST_LINK_MIR_insn_t *)&pgStack_150->optimize_level)->prev = 0;
          *(undefined4 *)((long)&pgStack_150->ctx + 4) = 0;
          if (uVar49 < uVar51) {
            iVar33 = uVar51 - uVar49;
            pVVar52 = (bitmap_t)(pbVar35 + (ulong)uVar49 * 3 + 2);
            pgVar58 = pgStack_150;
            do {
              if ((int)pVVar52[-1].size != 0) {
                pcStack_160 = (code *)0x16e3ae;
                el.lr = (live_range_t_conflict)pVVar52->els_num;
                el._0_8_ = pVVar52[-1].varr;
                HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar58,el,HTAB_INSERT,(lr_gap_t *)res);
                pbVar35 = (bitmap_el_t *)pVVar52->els_num;
                pcStack_160 = (code *)0x16e3c9;
                (*(code *)((MIR_op_t *)&pgStack_150->debug_level)->data)
                          (res->ctx,((DLIST_LINK_MIR_insn_t *)&res->optimize_level)->prev,
                           pVVar52[-1].varr,pbVar35,pgStack_148);
                pgVar58 = pgStack_150;
              }
              pVVar52 = pVVar52 + 1;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          pgVar45 = (gen_ctx_t)((ulong)pMVar61 & 0xffffffff);
          goto LAB_0016e3d9;
        }
        pgVar53 = (gen_ctx *)((long)pgVar46 * 0x18);
        pcStack_160 = (code *)0x16e348;
        pbVar24 = (bitmap_el_t *)realloc(pgVar59,(size_t)pgVar53);
        pVVar56->varr = pbVar24;
        pVVar52 = (bitmap_t)
                  (((anon_union_32_12_57d33f68_for_u *)&pgStack_150->addr_insn_p)->str).len;
        pVVar56->size = (size_t)pgVar46;
        pVVar56->els_num = (size_t)pgVar46;
        pgVar58 = pgStack_150;
        if (pVVar52 != (bitmap_t)0x0) goto LAB_0016e368;
      }
      pcStack_160 = rewrite_insn;
      HTAB_lr_gap_t_do_cold_2();
      pMVar72 = pgVar59->ctx;
      paStack_338 = (anon_union_32_12_57d33f68_for_u *)0x0;
      pcStack_408 = (code *)0x16e61a;
      pgStack_188 = pgVar46;
      pgStack_180 = pgVar68;
      pMStack_178 = pMVar61;
      pVStack_170 = pVVar52;
      pgStack_168 = res;
      pcStack_160 = (code *)uVar50;
      MIR_new_int_op(pMVar72,0);
      pcStack_408 = (code *)0x16e62c;
      MIR_new_int_op(pMVar72,0);
      pcStack_408 = (code *)0x16e637;
      sStack_320 = MIR_insn_nops(pMVar72,(MIR_insn_t_conflict)pgVar53);
      pMStack_330 = (MIR_op_t *)&pgVar53->debug_level;
      pMStack_328 = (MIR_insn_t_conflict)((long)&pgVar53->addr_regs + 4);
      uVar50 = CONCAT71((int7)((ulong)pgVar68 >> 8),1);
      uStack_344 = 0xffffffff;
      uStack_340 = 0xffffffff;
      do {
        if (sStack_320 != 0) {
          sVar64 = 0;
          pMVar27 = pMStack_328;
          do {
            pcStack_408 = (code *)0x16e6b0;
            MVar19 = MIR_insn_op_mode(pMVar72,(MIR_insn_t_conflict)pgVar53,sVar64,&iStack_33c);
            iVar33 = iStack_33c;
            if ((byte)uVar50 != 0) {
              if ((iStack_33c != 0) &&
                 (cVar32 = *(char *)((long)&pMVar27[-1].ops[0].u + 4), cVar32 != '\v'))
              goto LAB_0016e6e9;
              goto LAB_0016eae5;
            }
            cVar32 = *(char *)((long)&pMVar27[-1].ops[0].u + 4);
            if (iStack_33c == 0) {
              iVar33 = 0;
            }
            else if (cVar32 != '\v') goto LAB_0016eae5;
LAB_0016e6e9:
            if (cVar32 != '\v') {
              if (cVar32 != '\x02') goto LAB_0016eae5;
              uVar43 = pMVar27[-1].ops[0].u.mem.nloc;
              uVar26 = (ulong)uVar43;
              if (uVar26 < 0x22) {
                pVVar52 = pgVar59->func_used_hard_regs;
                pcStack_408 = (code *)0x16e725;
                bitmap_expand(pVVar52,uVar26 + 1);
                if (pVVar52 != (bitmap_t)0x0) {
                  *pVVar52->varr = *pVVar52->varr | 1L << (uVar26 & 0x3f);
                  if (pbVar35 != (bitmap_el_t *)0x0) {
                    pcStack_408 = (code *)0x16e757;
                    update_live(pMVar27[-1].ops[0].u.mem.nloc,iStack_33c,(bitmap_t)pbVar35[1]);
                  }
                  goto LAB_0016eae5;
                }
LAB_0016fce6:
                pcStack_408 = (code *)0x16fceb;
                rewrite_insn_cold_9();
                goto LAB_0016fceb;
              }
              if (iVar33 == 0) {
                pVVar8 = pgVar59->ra_ctx->reg_renumber;
                if (((pVVar8 != (VARR_MIR_reg_t *)0x0) && (pVVar8->varr != (MIR_reg_t *)0x0)) &&
                   (uVar26 < pVVar8->els_num)) {
                  paStack_338 = (anon_union_32_12_57d33f68_for_u *)
                                (ulong)((int)paStack_338 +
                                       (uint)(MVar19 - MIR_OP_REF < 0xfffffffd &&
                                             0x21 < pVVar8->varr[uVar26]));
                  goto LAB_0016e909;
                }
LAB_0016fce1:
                pcStack_408 = (code *)0x16fce6;
                rewrite_insn_cold_8();
                goto LAB_0016fce6;
              }
LAB_0016e909:
              if (pbVar35 == (bitmap_el_t *)0x0) goto LAB_0016eae5;
              pcStack_408 = (code *)0x16e91a;
              update_live(uVar43,iVar33,(bitmap_t)pbVar35[1]);
              plVar3 = (long *)pbVar35[2];
              if (plVar3 != (long *)0x0) {
                uVar43 = pMVar27[-1].ops[0].u.mem.nloc;
                uVar26 = (ulong)uVar43;
                if (((ulong)(*plVar3 << 6) <= uVar26) ||
                   (uVar36 = (ulong)(uVar43 >> 6), uVar60 = *(ulong *)(plVar3[2] + uVar36 * 8),
                   *(ulong *)(plVar3[2] + uVar36 * 8) = uVar60 & ~(1L << (uVar26 & 0x3f)),
                   (uVar60 >> (uVar26 & 0x3f) & 1) == 0)) goto LAB_0016eae5;
                MVar21 = pMVar27[-1].ops[0].u.mem.nloc;
LAB_0016eac5:
                pgVar58 = (gen_ctx_t)&DAT_00000001;
                puVar65 = (undefined8 *)0x0;
                pcStack_408 = (code *)0x16eae5;
                spill_restore_reg(pgVar59,MVar21,base_reg,(MIR_insn_t)pgVar53,1,0);
                goto LAB_0016eae5;
              }
LAB_0016fcf5:
              pcStack_408 = (code *)0x16fcfa;
              rewrite_insn_cold_7();
LAB_0016fcfa:
              pcStack_408 = (code *)0x16fcff;
              rewrite_insn_cold_4();
LAB_0016fcff:
              pcStack_408 = (code *)0x16fd04;
              rewrite_insn_cold_2();
LAB_0016fd04:
              pcStack_408 = (code *)0x16fd09;
              rewrite_insn_cold_1();
              goto LAB_0016fd09;
            }
            uVar26 = (ulong)*(uint *)((long)&pMVar27[-1].ops[0].u + 0x1c);
            if (uVar26 < 0x22) {
              pVVar52 = pgVar59->func_used_hard_regs;
              pcStack_408 = (code *)0x16e788;
              bitmap_expand(pVVar52,uVar26 + 1);
              if (pVVar52 != (bitmap_t)0x0) {
                *pVVar52->varr = *pVVar52->varr | 1L << (uVar26 & 0x3f);
                goto LAB_0016e7aa;
              }
LAB_0016fceb:
              pcStack_408 = (code *)0x16fcf0;
              rewrite_insn_cold_6();
LAB_0016fcf0:
              pcStack_408 = (code *)0x16fcf5;
              rewrite_insn_cold_5();
              goto LAB_0016fcf5;
            }
LAB_0016e7aa:
            uVar26 = (ulong)*(uint *)&pMVar27->data;
            if (uVar26 < 0x22) {
              pVVar52 = pgVar59->func_used_hard_regs;
              pcStack_408 = (code *)0x16e7cd;
              bitmap_expand(pVVar52,uVar26 + 1);
              if (pVVar52 != (bitmap_t)0x0) {
                *pVVar52->varr = *pVVar52->varr | 1L << (uVar26 & 0x3f);
                goto LAB_0016e7ef;
              }
              goto LAB_0016fcf0;
            }
LAB_0016e7ef:
            uVar43 = *(uint *)((long)&pMVar27[-1].ops[0].u + 0x1c);
            uVar26 = (ulong)uVar43;
            if (uVar26 == 0xffffffff) {
              if (pbVar35 != (bitmap_el_t *)0x0) goto LAB_0016ea72;
              goto LAB_0016eae5;
            }
            uVar49 = *(uint *)&pMVar27->data;
            if (0xffffffdc < uVar49 - 0x22 || uVar43 < 0x22) goto LAB_0016e9fb;
            pVVar8 = pgVar59->ra_ctx->reg_renumber;
            if (((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
                (pMVar5 = pVVar8->varr, pMVar5 == (MIR_reg_t *)0x0)) || (pVVar8->els_num <= uVar26))
            {
              pcStack_408 = (code *)0x16fce1;
              rewrite_insn_cold_3();
              goto LAB_0016fce1;
            }
            if (0x21 < pMVar5[uVar26]) {
              if (pVVar8->els_num <= (ulong)uVar49) goto LAB_0016fd04;
              if (0x21 < pMVar5[uVar49]) {
                if (iStack_33c == 0) {
                  bVar48 = -1 < (int)uStack_344;
                  uStack_344 = (uint)sVar64;
                  uVar51 = uStack_340;
                  if (bVar48) goto LAB_0016fd66;
                }
                else {
                  bVar48 = -1 < (int)uStack_340;
                  uStack_340 = (uint)sVar64;
                  uVar51 = uStack_344;
                  if (bVar48) goto LAB_0016fd42;
                }
                if ((((int)uVar51 < 0) || (uVar43 != pMStack_330[uVar51].u.mem.base)) ||
                   (uVar49 != pMStack_330[uVar51].u.mem.index)) {
                  paStack_338 = (anon_union_32_12_57d33f68_for_u *)(ulong)((int)paStack_338 + 2);
                }
              }
            }
LAB_0016e9fb:
            if (pbVar35 == (bitmap_el_t *)0x0) goto LAB_0016eae5;
            pcStack_408 = (code *)0x16ea0f;
            update_live(uVar43,0,(bitmap_t)pbVar35[1]);
            uVar43 = *(uint *)((long)&pMVar27[-1].ops[0].u + 0x1c);
            uVar26 = (ulong)uVar43;
            if (0x21 < uVar26) {
              plVar3 = (long *)pbVar35[2];
              if (plVar3 != (long *)0x0) {
                if ((uVar26 < (ulong)(*plVar3 << 6)) &&
                   (uVar36 = (ulong)(uVar43 >> 6), uVar60 = *(ulong *)(plVar3[2] + uVar36 * 8),
                   *(ulong *)(plVar3[2] + uVar36 * 8) = uVar60 & ~(1L << (uVar26 & 0x3f)),
                   (uVar60 >> (uVar26 & 0x3f) & 1) != 0)) {
                  pgVar58 = (gen_ctx_t)&DAT_00000001;
                  puVar65 = (undefined8 *)0x0;
                  pcStack_408 = (code *)0x16ea72;
                  spill_restore_reg(pgVar59,*(MIR_reg_t *)((long)&pMVar27[-1].ops[0].u + 0x1c),
                                    base_reg,(MIR_insn_t)pgVar53,1,0);
                }
                goto LAB_0016ea72;
              }
              goto LAB_0016fcff;
            }
LAB_0016ea72:
            if (*(MIR_reg_t *)&pMVar27->data != 0xffffffff) {
              pcStack_408 = (code *)0x16ea84;
              update_live(*(MIR_reg_t *)&pMVar27->data,0,(bitmap_t)pbVar35[1]);
              uVar26 = (ulong)*(uint *)&pMVar27->data;
              if (uVar26 < 0x22) goto LAB_0016eae5;
              plVar3 = (long *)pbVar35[2];
              if (plVar3 != (long *)0x0) {
                if ((uVar26 < (ulong)(*plVar3 << 6)) &&
                   (uVar36 = (ulong)(*(uint *)&pMVar27->data >> 6),
                   uVar60 = *(ulong *)(plVar3[2] + uVar36 * 8),
                   *(ulong *)(plVar3[2] + uVar36 * 8) = uVar60 & ~(1L << (uVar26 & 0x3f)),
                   (uVar60 >> (uVar26 & 0x3f) & 1) != 0)) {
                  MVar21 = *(MIR_reg_t *)&pMVar27->data;
                  goto LAB_0016eac5;
                }
                goto LAB_0016eae5;
              }
              goto LAB_0016fcfa;
            }
LAB_0016eae5:
            sVar64 = sVar64 + 1;
            pMVar27 = (MIR_insn_t_conflict)&pMVar27->ops[0].u;
          } while (sStack_320 != sVar64);
        }
        if ((~(byte)uVar50 & 1) == 0 && pbVar35 != (bitmap_el_t *)0x0) {
          pcStack_408 = (code *)0x16eb29;
          target_get_early_clobbered_hard_regs
                    ((MIR_insn_t)pgVar53->debug_file,(MIR_reg_t *)&MStack_2b0,
                     (MIR_reg_t *)&MStack_2e0);
          if ((MIR_reg_t)MStack_2b0.data != 0xffffffff) {
            pcStack_408 = (code *)0x16eb43;
            update_live((MIR_reg_t)MStack_2b0.data,1,(bitmap_t)pbVar35[1]);
          }
          if ((MIR_reg_t)MStack_2e0.data != 0xffffffff) {
            pcStack_408 = (code *)0x16eb5d;
            update_live((MIR_reg_t)MStack_2e0.data,1,(bitmap_t)pbVar35[1]);
          }
          if (0xfffffffc < *(int *)&pgVar53->debug_file - 0xaaU) {
            pVVar52 = pgVar59->call_used_hard_regs[0x12];
            if (pVVar52 == (bitmap_t)0x0) goto LAB_0016fd3d;
            pgVar29 = (gen_ctx *)pgVar53->ctx;
            uVar26 = pVVar52->els_num;
            if (uVar26 != 0) {
              uVar36 = 0;
              uVar60 = 0;
              do {
                while ((pVVar52->varr[uVar36] == 0 ||
                       (uVar54 = pVVar52->varr[uVar36] >> (uVar60 & 0x3f), uVar54 == 0))) {
                  uVar36 = uVar36 + 1;
                  uVar60 = uVar36 * 0x40;
                  if (uVar26 == uVar36) goto LAB_0016ebfd;
                }
                uVar26 = uVar54 & 1;
                uVar36 = uVar60;
                while (uVar26 == 0) {
                  uVar36 = uVar36 + 1;
                  uVar26 = uVar54 & 2;
                  uVar54 = uVar54 >> 1;
                }
                uVar60 = uVar36 + 1;
                pcStack_408 = (code *)0x16ebee;
                update_live((MIR_reg_t)uVar36,1,(bitmap_t)pbVar35[1]);
                uVar26 = pVVar52->els_num;
                uVar36 = uVar60 >> 6;
              } while (uVar36 < uVar26);
            }
LAB_0016ebfd:
            pVVar52 = pgVar29->insn_to_consider;
            if (pVVar52 != (bitmap_t)0x0) {
              uVar26 = pVVar52->els_num;
              if (uVar26 != 0) {
                uVar36 = 0;
                uVar60 = 0;
                do {
                  while ((pVVar52->varr[uVar36] == 0 ||
                         (uVar54 = pVVar52->varr[uVar36] >> (uVar60 & 0x3f), uVar54 == 0))) {
                    uVar36 = uVar36 + 1;
                    uVar60 = uVar36 * 0x40;
                    if (uVar26 == uVar36) goto LAB_0016ec80;
                  }
                  uVar26 = uVar54 & 1;
                  uVar36 = uVar60;
                  while (uVar26 == 0) {
                    uVar36 = uVar36 + 1;
                    uVar26 = uVar54 & 2;
                    uVar54 = uVar54 >> 1;
                  }
                  uVar60 = uVar36 + 1;
                  pcStack_408 = (code *)0x16ec71;
                  update_live((MIR_reg_t)uVar36,0,(bitmap_t)pbVar35[1]);
                  uVar26 = pVVar52->els_num;
                  uVar36 = uVar60 >> 6;
                } while (uVar36 < uVar26);
              }
LAB_0016ec80:
              puVar6 = (ulong *)pbVar35[1];
              if (puVar6 != (ulong *)0x0) {
                uVar26 = *puVar6;
                if (uVar26 != 0) {
                  uVar36 = 0;
                  uVar60 = 0;
                  do {
                    while ((uVar54 = *(ulong *)(puVar6[2] + uVar36 * 8), uVar54 == 0 ||
                           (uVar54 = uVar54 >> (uVar60 & 0x3f), uVar54 == 0))) {
                      uVar36 = uVar36 + 1;
                      uVar60 = uVar36 * 0x40;
                      if (uVar26 == uVar36) goto LAB_0016ee44;
                    }
                    uVar26 = uVar54 & 1;
                    while (uVar26 == 0) {
                      uVar60 = uVar60 + 1;
                      uVar26 = uVar54 & 2;
                      uVar54 = uVar54 >> 1;
                    }
                    if (uVar60 < 0x22) goto LAB_0016ee26;
                    plVar3 = *(long **)(*pbVar35 + 0x78);
                    if (plVar3 == (long *)0x0) {
                      pcStack_408 = (code *)0x16fdc8;
                      rewrite_insn_cold_13();
                      goto LAB_0016fdc8;
                    }
                    uVar26 = uVar60 & 0xffffffff;
                    uVar43 = (uint)uVar60;
                    if (((ulong)(*plVar3 << 6) <= uVar26) ||
                       ((*(ulong *)(plVar3[2] + (uVar26 >> 6) * 8) >> (uVar60 & 0x3f) & 1) == 0)) {
                      pVVar8 = pgVar59->ra_ctx->reg_renumber;
                      if ((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
                         ((pVVar8->varr == (MIR_reg_t *)0x0 || (pVVar8->els_num <= uVar26)))) {
                        pcStack_408 = (code *)0x16fd66;
                        rewrite_insn_cold_12();
LAB_0016fd66:
                        pcStack_408 = (code *)0x16fd85;
                        __assert_fail("in_mem_op_num < 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x1f5f,
                                      "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                     );
                      }
                      pMVar37 = (MIR_insn_t)(ulong)pVVar8->varr[uVar26];
                      if (pMVar37 < (MIR_insn_t)0x22) {
                        pcStack_408 = (code *)0x16ed85;
                        pMStack_318 = pMVar37;
                        MIR_reg_type(pgVar59->ctx,uVar43 - 0x21,(pgVar59->curr_func_item->u).func);
                        pVVar52 = pgVar59->call_used_hard_regs[0x12];
                        if (pVVar52 == (bitmap_t)0x0) {
                          pcStack_408 = (code *)0x16fdfe;
                          rewrite_insn_cold_11();
                          goto LAB_0016fdfe;
                        }
                        pMVar37 = (MIR_insn_t)(pVVar52->els_num << 6);
                        if ((pMStack_318 < pMVar37) &&
                           ((*pVVar52->varr >> ((ulong)pMStack_318 & 0x3f) & 1) != 0)) {
                          pgVar68 = (gen_ctx_t)pbVar35[2];
                          sVar64 = uVar26 + 1;
                          pcStack_408 = (code *)0x16edce;
                          pgVar46 = pgVar68;
                          bitmap_expand((bitmap_t)pgVar68,sVar64);
                          iVar33 = (int)pgVar58;
                          iVar63 = (int)puVar65;
                          if (pgVar68 == (gen_ctx_t)0x0) {
                            pcStack_408 = spill_restore_reg;
                            rewrite_insn_cold_10();
                            pMVar72 = pgVar46->ctx;
                            MVar21 = (int)sVar64 - 0x21;
                            puStack_430 = puVar6;
                            uStack_428 = uVar50;
                            pbStack_420 = pbVar35;
                            uStack_418 = uVar60;
                            pgStack_410 = pgVar68;
                            pcStack_408 = (code *)uVar26;
                            MVar20 = MIR_reg_type(pMVar72,MVar21,(pgVar46->curr_func_item->u).func);
                            if (MVar20 == MIR_T_F) {
                              MVar19 = MIR_OP_FLOAT;
                            }
                            else if (MVar20 == MIR_T_D) {
                              MVar19 = MIR_OP_DOUBLE;
                            }
                            else {
                              MVar19 = (uint)(MVar20 == MIR_T_LD) * 4 + MIR_OP_INT;
                            }
                            prVar25 = pgVar46->ra_ctx;
                            pVVar8 = prVar25->reg_renumber;
                            if (((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
                                (pVVar8->varr == (MIR_reg_t *)0x0)) ||
                               (uVar50 = sVar64 & 0xffffffff, pVVar8->els_num <= uVar50))
                            goto LAB_0017022a;
                            uVar43 = pVVar8->varr[uVar50];
                            if (0x21 < uVar43) goto LAB_00170258;
                            pVVar55 = prVar25->used_locs;
                            if (pVVar55 == (VARR_bitmap_t *)0x0) {
                              spill_restore_reg_cold_6();
LAB_0017027c:
                              spill_restore_reg_cold_5();
                            }
                            else {
                              pVVar9 = prVar25->spill_cache;
                              if (pVVar9 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017027c;
                              if (((int)sVar64 == -1) || (pVVar9->els_num <= uVar50))
                              goto LAB_0017022f;
                              psVar10 = pVVar9->varr;
                              if (psVar10[uVar50].age == prVar25->spill_cache_age) {
                                MStack_4b0 = psVar10[uVar50].slot;
                                goto LAB_0017019a;
                              }
                              pVVar52 = prVar25->conflict_locs1;
                              if ((pVVar52 != (bitmap_t)0x0) &&
                                 (pVVar52->varr != (bitmap_el_t *)0x0)) {
                                ppVVar11 = pVVar55->varr;
                                pMVar72 = pgVar46->ctx;
                                pVVar52->els_num = 0;
                                pVVar12 = pgVar46->lr_ctx->var_live_ranges;
                                if ((pVVar12 == (VARR_live_range_t *)0x0) ||
                                   ((pVVar12->varr == (live_range_t_conflict *)0x0 ||
                                    (pVVar12->els_num <= uVar50)))) {
                                  spill_restore_reg_cold_3();
                                }
                                else {
                                  for (plVar31 = pVVar12->varr[uVar50];
                                      plVar31 != (live_range_t_conflict)0x0; plVar31 = plVar31->next
                                      ) {
                                    if (plVar31->start <= plVar31->finish) {
                                      lVar38 = (long)plVar31->start + -1;
                                      do {
                                        bitmap_ior(pVVar52,pVVar52,ppVVar11[lVar38 + 1]);
                                        lVar38 = lVar38 + 1;
                                      } while (lVar38 < plVar31->finish);
                                    }
                                  }
                                  MVar20 = MIR_reg_type(pMVar72,MVar21,
                                                        (pgVar46->curr_func_item->u).func);
                                  MStack_4b0 = get_stack_loc(pgVar46,pgVar46->ra_ctx->start_mem_loc,
                                                             MVar20,pVVar52,(int *)&MStack_468);
                                  psVar10[uVar50].slot = MStack_4b0;
                                  psVar10[uVar50].age = pgVar46->ra_ctx->spill_cache_age;
                                  pVVar12 = pgVar46->lr_ctx->var_live_ranges;
                                  if (((pVVar12 != (VARR_live_range_t *)0x0) &&
                                      (pVVar12->varr != (live_range_t_conflict *)0x0)) &&
                                     (uVar50 < pVVar12->els_num)) {
                                    plVar31 = pVVar12->varr[uVar50];
                                    if (plVar31 != (live_range_t_conflict)0x0) {
                                      do {
                                        iVar22 = plVar31->finish;
                                        lVar38 = (long)plVar31->start;
                                        if (plVar31->start <= iVar22) {
                                          do {
                                            uVar50 = (ulong)(uint)MStack_468.data;
                                            MVar21 = MStack_4b0;
                                            if (0 < (int)(uint)MStack_468.data) {
                                              do {
                                                pVVar52 = ppVVar11[lVar38];
                                                bitmap_expand(pVVar52,(ulong)MVar21 + 1);
                                                if (pVVar52 == (bitmap_t)0x0) {
                                                  spill_restore_reg_cold_1();
                                                  goto LAB_0017022a;
                                                }
                                                pVVar52->varr[MVar21 >> 6] =
                                                     pVVar52->varr[MVar21 >> 6] |
                                                     1L << ((ulong)MVar21 & 0x3f);
                                                MVar21 = MVar21 + 1;
                                                uVar50 = uVar50 - 1;
                                              } while (uVar50 != 0);
                                              iVar22 = plVar31->finish;
                                            }
                                            bVar48 = lVar38 < iVar22;
                                            lVar38 = lVar38 + 1;
                                          } while (bVar48);
                                        }
                                        plVar31 = plVar31->next;
                                      } while (plVar31 != (live_range_t)0x0);
                                    }
LAB_0017019a:
                                    if (((FILE *)pgVar46->debug_file != (FILE *)0x0) &&
                                       (1 < pgVar46->debug_level)) {
                                      pcVar42 = "Restore";
                                      if (iVar63 == 0) {
                                        pcVar42 = "Spill";
                                      }
                                      fprintf((FILE *)pgVar46->debug_file,"    %s r%d:",pcVar42,
                                              sVar64);
                                    }
                                    add_ld_st(pgVar46,&MStack_468,MStack_4b0,base_reg_00,MVar19,
                                              uVar43,(uint)(iVar63 == 0),10,pMVar37,iVar33);
                                    return;
                                  }
                                }
                                spill_restore_reg_cold_2();
LAB_00170258:
                                __assert_fail("hard_reg <= ST1_HARD_REG",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                              ,0x1eb0,
                                              "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)"
                                             );
                              }
                            }
                            iVar63 = (int)pVVar55;
                            iVar33 = (int)sVar64;
                            spill_restore_reg_cold_4();
                            uVar50 = (ulong)pMVar72 & 0xffffffff;
                            if (iVar63 == 0) {
                              sVar64 = uVar50 + 1;
                              pMVar61 = bm;
                              bitmap_expand((bitmap_t)bm,sVar64);
                              iVar63 = (int)sVar64;
                              if (bm != (MIR_context_t)0x0) {
                                *(ulong *)(bm->error_func + (uVar50 >> 6) * 8) =
                                     *(ulong *)(bm->error_func + (uVar50 >> 6) * 8) |
                                     1L << ((ulong)pMVar72 & 0x3f);
                                return;
                              }
                            }
                            else {
                              if (bm != (MIR_context_t)0x0) {
                                if (uVar50 < (ulong)((long)bm->gen_ctx << 6)) {
                                  bVar71 = (byte)uVar50 & 0x3f;
                                  *(ulong *)(bm->error_func + (uVar50 >> 6) * 8) =
                                       *(ulong *)(bm->error_func + (uVar50 >> 6) * 8) &
                                       (-2L << bVar71 | 0xfffffffffffffffeU >> 0x40 - bVar71);
                                }
                                return;
                              }
                              update_live_cold_1();
                              pMVar61 = pMVar72;
                            }
                            update_live_cold_2();
                            pvVar7 = pMVar61[1].environment_module.data;
                            lVar38 = 0x1e8;
                            uVar50 = (ulong)(iVar33 != 0);
                            if (iVar33 == 0) {
                              lVar38 = 0x188;
                            }
                            iVar33 = *(int *)((long)pvVar7 + uVar50 * 4 + 0x180);
                            lVar62 = (long)iVar33;
                            if (0 < lVar62) {
                              uVar49 = extraout_EDX_00 - 8;
                              lVar67 = 0;
                              uVar43 = 0;
                              goto LAB_00170360;
                            }
                            uVar43 = 0;
                            goto LAB_001703e4;
                          }
                          pvVar7 = (&pgVar68->curr_func_item->data)[uVar43 >> 6];
                          (&pgVar68->curr_func_item->data)[uVar43 >> 6] =
                               (void *)((ulong)pvVar7 | 1L << (uVar60 & 0x3f));
                          if (((ulong)pvVar7 >> (uVar60 & 0x3f) & 1) == 0) {
                            pgVar58 = (gen_ctx_t)&DAT_00000001;
                            puVar65 = (undefined8 *)&DAT_00000001;
                            pcStack_408 = (code *)0x16ee26;
                            spill_restore_reg(pgVar59,uVar43,base_reg,(MIR_insn_t)pgVar53,1,1);
                          }
                        }
                      }
                    }
LAB_0016ee26:
                    uVar26 = *puVar6;
                    uVar60 = uVar60 + 1;
                    uVar36 = uVar60 >> 6;
                  } while (uVar36 < uVar26);
                }
                goto LAB_0016ee44;
              }
              pcStack_408 = (code *)0x16fd38;
              rewrite_insn_cold_14();
            }
            pcStack_408 = (code *)0x16fd3d;
            rewrite_insn_cold_15();
LAB_0016fd3d:
            pcStack_408 = (code *)0x16fd42;
            rewrite_insn_cold_16();
LAB_0016fd42:
            pcStack_408 = (code *)0x16fd61;
            __assert_fail("out_mem_op_num < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1f5b,
                          "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                         );
          }
        }
LAB_0016ee44:
        uVar26 = uVar50 & 1;
        uVar50 = 0;
      } while (uVar26 != 0);
      prVar25 = pgVar59->ra_ctx;
      prVar25->in_reloads_num = 0;
      prVar25->out_reloads_num = 0;
      if (2 < (int)(MIR_reg_t)paStack_338) {
        if ((int)(uStack_344 & uStack_340) < 0) {
LAB_0016fdfe:
          pcStack_408 = (code *)0x16fe1d;
          __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
        }
        pMVar61 = pgVar59->ctx;
        uVar50 = (ulong)uStack_344;
        paVar41 = (anon_union_32_12_57d33f68_for_u *)(ulong)uStack_340;
        uVar43 = uStack_344;
        if (-1 < (int)uStack_340) {
          uVar43 = uStack_340;
        }
        uVar26 = (ulong)pMStack_330[(int)uVar43].u.mem.base;
        uVar60 = (ulong)pMStack_330[(int)uVar43].u.mem.index;
        if (-1 < (int)(uStack_344 | uStack_340)) {
          pMVar70 = pMStack_330 + uVar50;
          uVar13 = *(undefined8 *)((long)&pMVar70->u + 8);
          pcStack_408 = (code *)0x16ef15;
          op1._12_4_ = (int)((ulong)*(undefined8 *)&pMVar70->field_0x8 >> 0x20);
          op1.data = pMVar70->data;
          op1._8_4_ = *(undefined4 *)&pMVar70->field_0x8;
          op1.u.i = (pMVar70->u).i;
          op1.u.mem.nonalias = (int)uVar13;
          op1.u.mem.nloc = (int)((ulong)uVar13 >> 0x20);
          op1.u._16_8_ = *(undefined8 *)((long)&pMStack_330[uVar50].u + 0x10);
          op1.u.mem.disp = pMStack_330[uVar50].u.mem.disp;
          op2.u._16_8_ = *(undefined8 *)((long)&pMStack_330[(long)paVar41].u + 0x10);
          op2._0_32_ = *(undefined1 (*) [32])(pMStack_330 + (long)paVar41);
          op2.u.mem.disp = pMStack_330[(long)paVar41].u.mem.disp;
          iVar33 = MIR_op_eq_p(pMVar61,op1,op2);
          if (iVar33 == 0) {
            pcStack_408 = (code *)0x16fe99;
            __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
          }
          prVar25 = pgVar59->ra_ctx;
        }
        pVVar8 = prVar25->reg_renumber;
        paStack_338 = paVar41;
        if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
           (pVVar8->els_num <= uVar26)) {
LAB_0016fdc8:
          pcStack_408 = (code *)0x16fdcd;
          rewrite_insn_cold_20();
        }
        else {
          pcStack_408 = (code *)0x16efa3;
          add_ld_st(pgVar59,&MStack_2b0,pVVar8->varr[uVar26],base_reg,MIR_OP_INT,10,0,10,
                    (MIR_insn_t)pgVar53,0);
          pMVar70 = pMStack_330;
          pVVar8 = pgVar59->ra_ctx->reg_renumber;
          if (((pVVar8 != (VARR_MIR_reg_t *)0x0) && (pVVar8->varr != (MIR_reg_t *)0x0)) &&
             (uVar60 < pVVar8->els_num)) {
            pcStack_408 = (code *)0x16f01f;
            add_ld_st(pgVar59,&MStack_2b0,pVVar8->varr[uVar60],base_reg,MIR_OP_INT,0xb,0,0xb,
                      (MIR_insn_t)pgVar53,0);
            pcStack_408 = (code *)0x16f034;
            _MIR_new_var_op(pMVar61,10);
            pcStack_408 = (code *)0x16f049;
            _MIR_new_var_op(pMVar61,0xb);
            bVar71 = pMVar70[(int)uVar43].u.mem.scale;
            uVar26 = (ulong)bVar71;
            if (bVar71 == 0) {
              iVar28 = -1;
LAB_0016f08a:
              pcStack_408 = (code *)0x16f09d;
              MIR_new_int_op(pMVar61,iVar28);
              pcStack_408 = (code *)0x16f0ef;
              pMVar27 = MIR_new_insn(pMVar61,MIR_LSH);
              pcStack_408 = (code *)0x16f100;
              gen_add_insn_before(pgVar59,(MIR_insn_t)pgVar53,pMVar27);
              if (((FILE *)pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
                pcStack_408 = (code *)0x16f126;
                fwrite("      ",6,1,(FILE *)pgVar59->debug_file);
                pcStack_408 = (code *)0x16f143;
                MIR_output_insn(pMVar61,pgVar59->debug_file,pMVar27,
                                (pgVar59->curr_func_item->u).func,1);
              }
            }
            else if (bVar71 != 1) {
              lVar38 = 0;
              uVar60 = uVar26;
              if ((bVar71 & 1) == 0) {
                do {
                  lVar38 = lVar38 + 1;
                  uVar26 = uVar60 >> 1;
                  uVar36 = uVar60 & 2;
                  uVar60 = uVar26;
                } while (uVar36 == 0);
              }
              iVar28 = -1;
              if (uVar26 == 1) {
                iVar28 = lVar38;
              }
              goto LAB_0016f08a;
            }
            pcStack_408 = (code *)0x16f19c;
            pMVar27 = MIR_new_insn(pMVar61,MIR_ADD);
            pcStack_408 = (code *)0x16f1ad;
            gen_add_insn_before(pgVar59,(MIR_insn_t)pgVar53,pMVar27);
            if (((FILE *)pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
              pcStack_408 = (code *)0x16f1d3;
              fwrite("      ",6,1,(FILE *)pgVar59->debug_file);
              pcStack_408 = (code *)0x16f1f0;
              MIR_output_insn(pMVar61,pgVar59->debug_file,pMVar27,(pgVar59->curr_func_item->u).func,
                              1);
            }
            if (-1 < (int)uStack_340) {
              *(undefined8 *)((long)&pMStack_330[(long)paStack_338].u + 0x10) = 0xffffffff0000000a;
            }
            if (-1 < (int)uStack_344) {
              *(undefined8 *)((long)&pMStack_330[uVar50].u + 0x10) = 0xffffffff0000000a;
            }
            pcStack_408 = (code *)0x16f25c;
            get_reload_hreg(pgVar59,0xffffffff,6,0);
            goto LAB_0016f25c;
          }
        }
        pcStack_408 = (code *)0x16fdd2;
        rewrite_insn_cold_19();
LAB_0016fdd2:
        pcStack_408 = (code *)0x16fdd7;
        rewrite_insn_cold_17();
LAB_0016fdd7:
        pcStack_408 = (code *)0x16fdf9;
        __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1fb5,
                      "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)");
      }
LAB_0016f25c:
      pFVar47 = pgVar53->debug_file;
      if (0xfffffffb < (int)pFVar47 - 0x22U) {
        if (*(char *)&pgVar53->temp_bitmap2 != '\x02') {
          pcStack_408 = (code *)0x16fe3c;
          __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
        }
        uVar43 = *(uint *)&((DLIST_MIR_item_t *)&pgVar53->temp_bitmap3)->head;
        if (0xffffffdc < uVar43 - 0x22) {
          pcStack_408 = (code *)0x16fe5b;
          __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
        }
        pVVar8 = pgVar59->ra_ctx->reg_renumber;
        if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
           (pVVar8->els_num <= (ulong)uVar43)) goto LAB_0016fdd2;
        uVar49 = pVVar8->varr[uVar43];
        pMVar61 = pgVar59->ctx;
        pcStack_408 = (code *)0x16f2c9;
        MVar20 = MIR_reg_type(pMVar61,uVar43 - 0x21,(pgVar59->curr_func_item->u).func);
        if (uVar49 < 0x22) {
          pcStack_408 = (code *)0x16fe7a;
          __assert_fail("loc > ST1_HARD_REG",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
        }
        uVar49 = uVar49 - 0x22;
        if (pgVar59->target_ctx->keep_fp_p == '\0') {
          lVar38 = (ulong)uVar49 << 3;
        }
        else {
          lVar38 = -0xb0;
          if (((pgVar59->curr_func_item->u).func)->vararg_p == '\0') {
            lVar38 = 0;
          }
          lVar38 = lVar38 + (ulong)((MVar20 == MIR_T_LD) + 1 + uVar49) * -8;
        }
        pcStack_408 = (code *)0x16f32b;
        MVar21 = get_reload_hreg(pgVar59,0xffffffff,6,0);
        pcStack_408 = (code *)0x16f345;
        _MIR_new_var_op(pMVar61,MVar21);
        pcStack_408 = (code *)0x16f350;
        iVar28 = _MIR_addr_offset(pMVar61,*(MIR_insn_code_t *)&pgVar53->debug_file);
        pcStack_408 = (code *)0x16f369;
        MIR_new_int_op(pMVar61,lVar38 + iVar28);
        pcStack_408 = (code *)0x16f3a5;
        pMStack_328 = MIR_new_insn(pMVar61,MIR_MOV);
        pcStack_408 = (code *)0x16f3c2;
        _MIR_new_var_op(pMVar61,MVar21);
        paStack_338 = (anon_union_32_12_57d33f68_for_u *)CONCAT44(paStack_338._4_4_,MVar21);
        pcStack_408 = (code *)0x16f3de;
        _MIR_new_var_op(pMVar61,MVar21);
        pcStack_408 = (code *)0x16f3f8;
        _MIR_new_var_op(pMVar61,base_reg);
        pMVar27 = pMStack_328;
        pcStack_408 = (code *)0x16f45e;
        insn = MIR_new_insn(pMVar61,MIR_ADD);
        if (((FILE *)pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
          if (pgVar59->optimize_level == 0) {
            uVar43 = *(int *)&pgVar53->debug_file - 0xa7;
            pgVar29 = pgVar53;
            if ((uVar43 < 0xe) && ((0x2007U >> (uVar43 & 0x1f) & 1) != 0)) {
              pgVar29 = (gen_ctx *)pgVar53->ctx;
            }
          }
          else {
            pgVar29 = (gen_ctx *)&((gen_ctx *)pgVar53->ctx)->addr_insn_p;
          }
          pcStack_408 = (code *)0x16f4c2;
          fprintf((FILE *)pgVar59->debug_file,"    Adding before insn (in BB %lu) ",
                  ((gen_ctx *)pgVar29->ctx)->ctx);
          pcStack_408 = (code *)0x16f4e6;
          MIR_output_insn(pMVar61,pgVar59->debug_file,(MIR_insn_t_conflict)pgVar53,
                          (pgVar59->curr_func_item->u).func,0);
          pcStack_408 = (code *)0x16f501;
          fwrite(":\n      ",8,1,(FILE *)pgVar59->debug_file);
          pcStack_408 = (code *)0x16f520;
          MIR_output_insn(pMVar61,pgVar59->debug_file,pMVar27,(pgVar59->curr_func_item->u).func,1);
          pcStack_408 = (code *)0x16f53b;
          fwrite("      ",6,1,(FILE *)pgVar59->debug_file);
          pcStack_408 = (code *)0x16f55a;
          MIR_output_insn(pMVar61,pgVar59->debug_file,insn,(pgVar59->curr_func_item->u).func,1);
        }
        pcStack_408 = (code *)0x16f56c;
        gen_add_insn_before(pgVar59,(MIR_insn_t)pgVar53,pMVar27);
        pcStack_408 = (code *)0x16f57a;
        gen_add_insn_before(pgVar59,(MIR_insn_t)pgVar53,insn);
        if (((FILE *)pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
          pcStack_408 = (code *)0x16f5a4;
          fwrite("Changing ",9,1,(FILE *)pgVar59->debug_file);
          pcStack_408 = (code *)0x16f5be;
          MIR_output_insn(pMVar61,pgVar59->debug_file,(MIR_insn_t_conflict)pgVar53,
                          (pgVar59->curr_func_item->u).func,0);
        }
        *(undefined4 *)&pgVar53->debug_file = 0;
        pcStack_408 = (code *)0x16f5df;
        _MIR_new_var_op(pMVar61,(MIR_reg_t)paStack_338);
        pgVar53->temp_bitmap3 = (bitmap_t)auStack_1e0._0_8_;
        pgVar53->call_used_hard_regs[0] = (bitmap_t)auStack_1e0._8_8_;
        pgVar53->call_used_hard_regs[1] = (bitmap_t)auStack_1d0._0_8_;
        pgVar53->call_used_hard_regs[2] = (bitmap_t)auStack_1d0._8_8_;
        pgVar53->temp_bitmap = (bitmap_t)auStack_1f0._0_8_;
        pgVar53->temp_bitmap2 = (bitmap_t)auStack_1f0._8_8_;
        pgVar53->temp_bitmap3 = (bitmap_t)auStack_1e0._0_8_;
        pgVar53->call_used_hard_regs[0] = (bitmap_t)auStack_1e0._8_8_;
        if (((FILE *)pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
          pcStack_408 = (code *)0x16f61c;
          fwrite(" to ",4,1,(FILE *)pgVar59->debug_file);
          pcStack_408 = (code *)0x16f639;
          MIR_output_insn(pMVar61,pgVar59->debug_file,(MIR_insn_t_conflict)pgVar53,
                          (pgVar59->curr_func_item->u).func,1);
        }
        pFVar47 = pgVar53->debug_file;
      }
      if (sStack_320 == 0) goto LAB_0016fb2e;
      paStack_338 = (anon_union_32_12_57d33f68_for_u *)&pgVar53->addr_insn_p;
      pMVar27 = (MIR_insn_t_conflict)(ulong)((int)pFVar47 - 0xaa);
      sVar64 = 0;
      pMStack_328 = pMVar27;
      do {
        pMVar70 = pMStack_330 + sVar64;
        pcStack_408 = (code *)0x16f69f;
        MVar19 = MIR_insn_op_mode(pMVar72,(MIR_insn_t_conflict)pgVar53,sVar64,&iStack_33c);
        if ((pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
          auVar2 = *(undefined1 (*) [32])pMVar70;
          pauVar30 = (undefined1 (*) [32])apvStack_280;
          if (iStack_33c == 0) {
            pauVar30 = (undefined1 (*) [32])&pVStack_250;
          }
          *(anon_union_32_12_57d33f68_for_u *)(*pauVar30 + 0x10) = pMVar70->u;
          *pauVar30 = auVar2;
        }
        if (pMVar70->field_0x8 == '\v') {
          if (((uint)pMVar27 < 0xfffffffd) || (*(byte *)&pMVar70->u - 0x11 < 0xfffffffb)) {
            MVar21 = *(MIR_reg_t *)((long)&pMVar70->u + 0x10);
            if (0x22 < MVar21 + 1) {
              pcStack_408 = (code *)0x16f7dc;
              MVar21 = change_reg(pgVar59,&MStack_310,MVar21,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar53
                                  ,0);
              *(MIR_reg_t *)((long)&pMVar70->u + 0x10) = MVar21;
              if (MVar21 == 0xffffffff) {
                pcStack_408 = (code *)0x16fda4;
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar21 = (pMVar70->u).mem.index;
            if (0x22 < MVar21 + 1) {
              pcStack_408 = (code *)0x16f82f;
              MVar21 = change_reg(pgVar59,&MStack_310,MVar21,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar53
                                  ,0);
              (pMVar70->u).mem.index = MVar21;
              if (MVar21 == 0xffffffff) {
                pcStack_408 = (code *)0x16fdc3;
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((pMVar70->field_0x8 == '\x02') && (0x21 < (pMVar70->u).reg)) {
          if (MVar19 == MIR_OP_VAR) {
            if ((*(int *)&pgVar53->debug_file != 0xb9) &&
               ((sVar64 != 1 || (3 < *(int *)&pgVar53->debug_file - 0x1eU)))) goto LAB_0016fdd7;
            pcStack_408 = (code *)0x16f767;
            MVar20 = MIR_reg_type(pMVar72,(pMVar70->u).reg - 0x21,(pgVar59->curr_func_item->u).func)
            ;
            if (MVar20 == MIR_T_F) {
              MVar19 = MIR_OP_FLOAT;
            }
            else if (MVar20 == MIR_T_D) {
              MVar19 = MIR_OP_DOUBLE;
            }
            else {
              MVar19 = (uint)(MVar20 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar8 = pgVar59->ra_ctx->reg_renumber;
          if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
             (pVVar8->els_num <= (ulong)(pMVar70->u).reg)) {
LAB_0016fd09:
            pcStack_408 = (code *)0x16fd11;
            rewrite_insn_cold_18();
LAB_0016fd11:
            pcStack_408 = (code *)0x16fd33;
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar64 == 0) && (*(int *)&pgVar53->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar43 = pVVar8->varr[(pMVar70->u).reg], 0x21 < uVar43)) {
            pMVar61 = pgVar59->ctx;
            pcStack_408 = (code *)0x16f8ea;
            MVar20 = MIR_reg_type(pMVar61,paStack_338->reg - 0x21,(pgVar59->curr_func_item->u).func)
            ;
            uVar43 = uVar43 - 0x22;
            if (pgVar59->target_ctx->keep_fp_p == '\0') {
              MVar39 = (ulong)uVar43 << 3;
            }
            else {
              lVar38 = -0xb0;
              if (((pgVar59->curr_func_item->u).func)->vararg_p == '\0') {
                lVar38 = 0;
              }
              MVar39 = lVar38 + (ulong)((MVar20 == MIR_T_LD) + 1 + uVar43) * -8;
            }
            auVar2 = *(undefined1 (*) [32])pMStack_330;
            MVar21 = ((anon_union_32_12_57d33f68_for_u *)&pgVar53->addr_insn_p)->reg;
            MStack_2b0.u._16_8_ = SUB328((pMStack_330->u).mem,0x10);
            MStack_2b0.u.mem.disp = (pMStack_330->u).mem.disp;
            MStack_2b0.data._0_4_ = auVar2._0_4_;
            MStack_2b0.data._4_4_ = auVar2._4_4_;
            MStack_2b0._8_8_ = auVar2._8_8_;
            MStack_2b0.u.i = auVar2._16_8_;
            MStack_2b0.u.str.s = auVar2._24_8_;
            pcStack_408 = (code *)0x16f98d;
            _MIR_new_var_mem_op(&MStack_2e0,pMVar61,MVar20,MVar39,base_reg,0xffffffff,'\0');
            pMVar27 = pMStack_328;
            pFVar47 = pgVar53->debug_file;
            if ((int)((ulong)pFVar47 >> 0x20) < 1) {
              pcStack_408 = (code *)0x16fa3c;
              iVar33 = find_insn_pattern(pgVar59,(MIR_insn_t)pgVar53,(int *)0x0);
              pMVar27 = pMStack_328;
              if (iVar33 < 0) goto LAB_0016faa5;
            }
            else {
              uVar50 = 0;
              uVar43 = 0;
              paVar41 = paStack_338;
              do {
                if ((*(char *)((long)paVar41 + -8) == '\x02') && (paVar41->reg == MVar21)) {
                  auVar2._4_4_ = MStack_2e0.data._4_4_;
                  auVar2._0_4_ = (MIR_reg_t)MStack_2e0.data;
                  auVar2._8_8_ = MStack_2e0._8_8_;
                  auVar2._16_8_ = MStack_2e0.u.i;
                  auVar2._24_8_ = MStack_2e0.u.str.s;
                  aVar16.str.s = MStack_2e0.u.str.s;
                  aVar16.i = MStack_2e0.u.i;
                  aVar16._16_8_ = MStack_2e0.u._16_8_;
                  aVar16.mem.disp = MStack_2e0.u.mem.disp;
                  *paVar41 = aVar16;
                  *(undefined1 (*) [32])((long)paVar41 + -0x10) = auVar2;
                  if (1 < (int)uVar43) goto LAB_0016fd11;
                  lVar38 = (long)(int)uVar43;
                  uVar43 = uVar43 + 1;
                  aiStack_220[lVar38] = (int)uVar50;
                }
                uVar50 = uVar50 + 1;
                paVar41 = (anon_union_32_12_57d33f68_for_u *)((long)paVar41 + 0x30);
              } while ((ulong)pFVar47 >> 0x20 != uVar50);
              pcStack_408 = (code *)0x16fa19;
              iVar33 = find_insn_pattern(pgVar59,(MIR_insn_t)pgVar53,(int *)0x0);
              if (iVar33 < 0) {
                if (0 < (int)uVar43) {
                  uVar50 = 0;
                  do {
                    iVar33 = aiStack_220[uVar50];
                    auVar17._4_4_ = MStack_2b0.data._4_4_;
                    auVar17._0_4_ = (MIR_reg_t)MStack_2b0.data;
                    auVar17._8_8_ = MStack_2b0._8_8_;
                    auVar17._16_8_ = MStack_2b0.u.i;
                    auVar17._24_8_ = MStack_2b0.u.str.s;
                    aVar18.str.s = MStack_2b0.u.str.s;
                    aVar18.i = MStack_2b0.u.i;
                    aVar18._16_8_ = MStack_2b0.u._16_8_;
                    aVar18.mem.disp = MStack_2b0.u.mem.disp;
                    uVar50 = uVar50 + 1;
                    pMStack_330[iVar33].u = aVar18;
                    *(undefined1 (*) [32])(pMStack_330 + iVar33) = auVar17;
                  } while (uVar43 != uVar50);
                }
                goto LAB_0016faa5;
              }
            }
          }
          else {
LAB_0016faa5:
            pcStack_408 = (code *)0x16fade;
            MVar21 = change_reg(pgVar59,&MStack_310,(pMVar70->u).reg,base_reg,MVar19,
                                (MIR_insn_t)pgVar53,iStack_33c);
            if (MVar21 == 0xffffffff) {
              auVar14._8_8_ = MStack_310._8_8_;
              auVar14._0_8_ = MStack_310.data;
              auVar14._16_8_ = MStack_310.u.i;
              auVar14._24_8_ = MStack_310.u.str.s;
              aVar15.str.s = MStack_310.u.str.s;
              aVar15.i = MStack_310.u.i;
              aVar15._16_8_ = MStack_310.u._16_8_;
              aVar15.mem.disp = MStack_310.u.mem.disp;
              pMVar70->u = aVar15;
              *(undefined1 (*) [32])pMVar70 = auVar14;
            }
            else {
              (pMVar70->u).reg = MVar21;
            }
          }
        }
        sVar64 = sVar64 + 1;
        if (sVar64 == sStack_320) {
          pFVar47 = pgVar53->debug_file;
LAB_0016fb2e:
          pMVar70 = pMStack_330;
          if (((ulong)pFVar47 & 0xfffffffc) == 0) {
            uVar13 = *(undefined8 *)((long)&pMStack_330->u + 8);
            pcStack_408 = (code *)0x16fb85;
            op1_00._12_4_ = (int)((ulong)*(undefined8 *)&pMStack_330->field_0x8 >> 0x20);
            op1_00.data = pMStack_330->data;
            op1_00._8_4_ = *(undefined4 *)&pMStack_330->field_0x8;
            op1_00.u.i = (pMStack_330->u).i;
            op1_00.u.mem.nonalias = (int)uVar13;
            op1_00.u.mem.nloc = (int)((ulong)uVar13 >> 0x20);
            op1_00.u._16_8_ = *(undefined8 *)((long)&pMStack_330->u + 0x10);
            op1_00.u.mem.disp = (pMStack_330->u).mem.disp;
            iVar33 = MIR_op_eq_p(pMVar72,op1_00,*(MIR_op_t *)&pgVar53->temp_bitmap);
            if (iVar33 != 0) {
              if (((FILE *)pgVar59->debug_file != (FILE *)0x0) && (1 < pgVar59->debug_level)) {
                pcStack_408 = (code *)0x16fbc7;
                fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar59->debug_file);
                pcStack_408 = (code *)0x16fbe9;
                MIR_output_insn(pMVar72,pgVar59->debug_file,(MIR_insn_t_conflict)pgVar53,
                                (pgVar59->curr_func_item->u).func,0);
                pcStack_408 = (code *)0x16fc03;
                fwrite(" which was ",0xb,1,(FILE *)pgVar59->debug_file);
                (pMVar70->u).i = iStack_270;
                (pMVar70->u).str.s = pcStack_268;
                *(undefined8 *)((long)&pMVar70->u + 0x10) = uStack_260;
                (pMVar70->u).mem.disp = MStack_258;
                pMVar70->data = apvStack_280[0];
                *(void **)&pMVar70->field_0x8 = apvStack_280[1];
                (pMVar70->u).i = iStack_270;
                (pMVar70->u).str.s = pcStack_268;
                pgVar53->temp_bitmap3 = pVStack_240;
                pgVar53->call_used_hard_regs[0] = pVStack_238;
                pgVar53->call_used_hard_regs[1] = pVStack_230;
                pgVar53->call_used_hard_regs[2] = pVStack_228;
                pgVar53->temp_bitmap = pVStack_250;
                pgVar53->temp_bitmap2 = pVStack_248;
                pgVar53->temp_bitmap3 = pVStack_240;
                pgVar53->call_used_hard_regs[0] = pVStack_238;
                pcStack_408 = (code *)0x16fc5d;
                MIR_output_insn(pMVar72,pgVar59->debug_file,(MIR_insn_t_conflict)pgVar53,
                                (pgVar59->curr_func_item->u).func,1);
              }
              if ((((pgVar59->optimize_level != 0) &&
                   (pMVar72 = pgVar53->ctx, pMVar72 != (MIR_context_t)0x0)) &&
                  ((MIR_context_t)pMVar72->temp_string[3].size == pMVar72)) &&
                 ((MIR_context_t)pMVar72->temp_string[3].varr == pMVar72)) {
                pcStack_408 = (code *)0x16fc8e;
                pMVar27 = MIR_new_insn_arr(pgVar59->ctx,MIR_USE,0,(MIR_op_t *)0x0);
                pcStack_408 = (code *)0x16fca4;
                MIR_insert_insn_before
                          (pgVar59->ctx,pgVar59->curr_func_item,
                           (MIR_insn_t_conflict)pMVar72->gen_ctx,pMVar27);
                pcStack_408 = (code *)0x16fcb5;
                add_new_bb_insn(pgVar59,pMVar27,(bb_t_conflict)pMVar72->temp_string,0);
              }
              pcStack_408 = (code *)0x16fcc0;
              gen_delete_insn(pgVar59,(MIR_insn_t)pgVar53);
            }
          }
          return;
        }
      } while( true );
    }
    pgVar46 = (gen_ctx_t)(ulong)uVar66;
    pgVar59 = (gen_ctx_t)((ulong)pgVar53 & 0xffffffff);
    do {
      if (pgVar59 < (gen_ctx_t)(*in_RCX << 6)) {
        pMVar61 = (MIR_context_t)((ulong)pgVar59 >> 6);
        pgVar58 = *(gen_ctx_t *)(in_RCX[2] + (long)pMVar61 * 8);
        if (((ulong)pgVar58 >> ((ulong)pgVar59 & 0x3f) & 1) != 0) goto LAB_0016df10;
      }
      pgVar59 = (gen_ctx_t)(ulong)((int)pgVar59 + 1);
      pgVar46 = (gen_ctx_t)((long)&pgVar46[-1].spot_attrs + 7);
    } while (pgVar46 != (gen_ctx_t)0x0);
    uVar49 = uVar49 & uVar51 - 0x22;
    uVar26 = (ulong)uVar49;
    uVar49 = ~uVar43 | uVar49;
    pgVar46 = (gen_ctx_t)(ulong)uVar49;
    if (uVar49 == 0) {
      uVar43 = uVar51;
    }
LAB_0016df10:
    pgVar53 = (gen_ctx *)(ulong)(uVar51 + 1);
  } while (pgVar53 <= pgVar29);
  if (uVar43 == 0xffffffff) {
LAB_0016df1c:
    uVar66 = 1;
    uVar43 = 0;
    do {
      bVar48 = uVar43 == 0;
      uVar43 = 2;
      if (bVar48) {
        bVar48 = (uint)sVar64 < 0xffffffde && extraout_EDX == 10;
        uVar66 = bVar48 + 1;
        uVar43 = (uint)(((uint)bVar48 & (uint)sVar64) == 0);
      }
      sVar64 = sVar64 + 1;
    } while (uVar43 < uVar66);
    pVVar56[0x13].size = sVar64;
  }
  *in_R8 = uVar66;
  return;
}

Assistant:

static void setup_used_hard_regs (gen_ctx_t gen_ctx, MIR_type_t type, MIR_reg_t hard_reg) {
  MIR_reg_t curr_hard_reg;
  int i, slots_num = target_locs_num (hard_reg, type);

  for (i = 0; i < slots_num; i++)
    if ((curr_hard_reg = target_nth_loc (hard_reg, type, i)) <= MAX_HARD_REG)
      bitmap_set_bit_p (func_used_hard_regs, curr_hard_reg);
}